

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_dxil_builtins.cpp
# Opt level: O3

bool dxil_spv::analyze_alloca_cbv_forwarding_pre_resource_emit
               (Impl *impl,Type *scalar_type,AllocaCBVForwardingTracking *tracking)

{
  bool bVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  iterator iVar4;
  
  if (tracking->cbv_handle != (Value *)0x0) {
    if (((tracking->has_load == true) && (tracking->stride != 0)) &&
       (tracking->min_highest_store_index <= tracking->highest_store_index)) {
      iVar2 = std::
              _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(impl->llvm_value_to_cbv_resource_index_map)._M_h,&tracking->cbv_handle);
      if (iVar2.
          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
          _M_cur == (__node_type *)0x0) {
        iVar4 = std::
                _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(impl->llvm_annotate_handle_uses)._M_h,&tracking->cbv_handle);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false>
            ._M_cur == (__node_type *)0x0) {
          return true;
        }
        pmVar3 = (mapped_type *)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false>
                        ._M_cur + 0x17);
      }
      else {
        pmVar3 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&impl->cbv_access_tracking,
                              (key_type *)
                              ((long)iVar2.
                                     super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>
                                     ._M_cur + 0x10));
      }
      bVar1 = LLVMBC::Type::isFloatingPointTy(scalar_type);
      pmVar3->raw_access_buffer_declarations[bVar1][2][0] = true;
    }
    else {
      tracking->cbv_handle = (Value *)0x0;
    }
  }
  return true;
}

Assistant:

bool analyze_alloca_cbv_forwarding_pre_resource_emit(Converter::Impl &impl, const llvm::Type *scalar_type,
                                                     AllocaCBVForwardingTracking &tracking)
{
	if (!tracking.cbv_handle)
		return true;

	if (!tracking.has_load || !tracking.stride)
	{
		tracking.cbv_handle = nullptr;
		return true;
	}

	// Robustness purposes, if we cannot prove that all input data was read,
	// we may falsely cause an OOB read on BDA to happen when we redirect a load to it.
	if (tracking.highest_store_index < tracking.min_highest_store_index)
	{
		tracking.cbv_handle = nullptr;
		return true;
	}

	Converter::Impl::AccessTracking *cbv_tracking = nullptr;
	auto itr = impl.llvm_value_to_cbv_resource_index_map.find(tracking.cbv_handle);
	if (itr != impl.llvm_value_to_cbv_resource_index_map.end())
		cbv_tracking = &impl.cbv_access_tracking[itr->second];

	if (!cbv_tracking)
	{
		auto annotate_itr = impl.llvm_annotate_handle_uses.find(tracking.cbv_handle);
		if (annotate_itr != impl.llvm_annotate_handle_uses.end())
			cbv_tracking = &annotate_itr->second.tracking;
	}

	if (cbv_tracking)
	{
		auto raw_type = scalar_type->isFloatingPointTy() ? RawType::Float : RawType::Integer;
		cbv_tracking->raw_access_buffer_declarations[int(raw_type)][int(RawWidth::B32)][int(RawVecSize::V1)] = true;
	}

	return true;
}